

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

bool __thiscall LinearNE<2,_3,_1>::propagate(LinearNE<2,_3,_1> *this)

{
  BoolView *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  Lit LVar4;
  Lit *pLVar5;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  anon_union_8_2_743a5d44_for_Reason_0 local_48;
  
  this_00 = &this->r;
  bVar1 = BoolView::isFalse(this_00);
  if (bVar1) {
    return true;
  }
  if ((this->num_unfixed).v == 0) {
    if ((this->sum_fixed).v != 0) {
      return true;
    }
    if (so.lazy == true) {
      r._pt = Reason_new(this->sz + 1);
      lVar8 = 0;
      lVar10 = 0;
      while (lVar10 < this->sz) {
        iVar2 = (**(code **)(**(long **)((long)&this->x->var + lVar8) + 0x50))();
        lVar10 = lVar10 + 1;
        pLVar5 = Clause::operator[](r._pt,(int)lVar10);
        pLVar5->x = iVar2;
        lVar8 = lVar8 + 0x10;
      }
    }
    else {
      r._pt = (Clause *)0x0;
    }
    bVar1 = BoolView::setVal(this_00,false,(Reason)r);
    return bVar1;
  }
  bVar1 = BoolView::isTrue(this_00);
  if (!bVar1) {
    return true;
  }
  uVar11 = 0;
  lVar10 = 0;
  do {
    lVar9 = lVar10;
    lVar8 = *(long *)((long)&this->x->var + lVar9);
    lVar10 = lVar9 + 0x10;
    uVar11 = uVar11 - 1;
  } while (*(int *)(lVar8 + 0xc) == *(int *)(lVar8 + 0x10));
  iVar2 = *(int *)&(this->super_Propagator).field_0x14;
  iVar6 = (int)~uVar11;
  if (iVar6 < iVar2) {
    bVar1 = IntView<2>::indomain((IntView<2> *)((long)&this->x->var + lVar9),-(this->sum_fixed).v);
    if (bVar1) goto LAB_00188fbf;
    iVar2 = *(int *)&(this->super_Propagator).field_0x14;
  }
  if (iVar6 < iVar2) {
    return true;
  }
  bVar1 = IntView<3>::indomain((IntView<3> *)((long)&this->y->var + lVar9),-(this->sum_fixed).v);
  if (!bVar1) {
    return true;
  }
LAB_00188fbf:
  if (so.lazy == true) {
    local_48._pt = Reason_new(this->sz + 1);
    lVar8 = 0;
    uVar7 = 0;
    while (~uVar11 != uVar7) {
      iVar2 = (**(code **)(**(long **)((long)&this->x->var + lVar8) + 0x50))();
      uVar7 = uVar7 + 1;
      pLVar5 = Clause::operator[](local_48._pt,(int)uVar7);
      pLVar5->x = iVar2;
      lVar8 = lVar8 + 0x10;
    }
    for (iVar2 = -(int)uVar11; iVar2 < this->sz; iVar2 = iVar2 + 1) {
      iVar3 = (**(code **)(**(long **)((long)&this->x->var + lVar10) + 0x50))();
      pLVar5 = Clause::operator[](local_48._pt,iVar2);
      pLVar5->x = iVar3;
      lVar10 = lVar10 + 0x10;
    }
    LVar4 = BoolView::getValLit(this_00);
    pLVar5 = Clause::operator[](local_48._pt,this->sz);
    pLVar5->x = LVar4.x;
  }
  else {
    local_48._pt = (Clause *)0x0;
  }
  if (iVar6 < *(int *)&(this->super_Propagator).field_0x14) {
    bVar1 = IntView<2>::remVal((IntView<2> *)((long)&this->x->var + lVar9),-(this->sum_fixed).v,
                               (Reason)local_48,true);
  }
  else {
    bVar1 = IntView<3>::remVal((IntView<3> *)((long)&this->y->var + lVar9),-(this->sum_fixed).v,
                               (Reason)local_48,true);
  }
  return bVar1 != false;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		assert(num_unfixed <= 1);

		if (num_unfixed == 0) {
			if (sum_fixed == 0) {
				Clause* m_r = nullptr;
				if (so.lazy) {
					m_r = Reason_new(sz + 1);
					for (int i = 0; i < sz; i++) {
						(*m_r)[i + 1] = x[i].getValLit();
					}
				}
				return r.setVal(false, m_r);
			}
			return true;
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		assert(num_unfixed == 1);

		int k = 0;
		while (x[k].isFixed()) {
			k++;
		}
		assert(k < sz);
		for (int i = k + 1; i < sz; i++) {
			assert(x[i].isFixed());
		}

		if ((k < sp && x[k].remValNotR(-sum_fixed)) || (k >= sp && y[k].remValNotR(-sum_fixed))) {
			Clause* m_r = nullptr;
			if (so.lazy) {
				m_r = Reason_new(sz + R);
				for (int i = 0; i < k; i++) {
					(*m_r)[i + 1] = x[i].getValLit();
				}
				for (int i = k + 1; i < sz; i++) {
					(*m_r)[i] = x[i].getValLit();
				}
				if (R != 0) {
					(*m_r)[sz] = r.getValLit();
				}
			}
			if (k < sp) {
				if (!x[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			} else {
				if (!y[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			}
		}

		return true;
	}